

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O0

void __thiscall
Imf_2_5::DeepScanLineInputFile::DeepScanLineInputFile
          (DeepScanLineInputFile *this,InputPartData *part)

{
  byte bVar1;
  _func_int **pp_Var2;
  long in_RSI;
  GenericInputFile *in_RDI;
  undefined4 in_stack_00000058;
  int in_stack_0000005c;
  Data *in_stack_00000060;
  Header *in_stack_00000418;
  DeepScanLineInputFile *in_stack_00000420;
  
  GenericInputFile::GenericInputFile(in_RDI);
  in_RDI->_vptr_GenericInputFile = (_func_int **)&PTR__DeepScanLineInputFile_00562988;
  pp_Var2 = (_func_int **)operator_new(0x208);
  Data::Data(in_stack_00000060,in_stack_0000005c);
  in_RDI[1]._vptr_GenericInputFile = pp_Var2;
  *(undefined1 *)(in_RDI[1]._vptr_GenericInputFile + 0x40) = 0;
  in_RDI[1]._vptr_GenericInputFile[0x3f] = *(_func_int **)(in_RSI + 0x48);
  bVar1 = (**(code **)(**(long **)(in_RDI[1]._vptr_GenericInputFile[0x3f] + 0x28) + 0x10))();
  *(byte *)(in_RDI[1]._vptr_GenericInputFile + 0x30) = bVar1 & 1;
  *(undefined4 *)(in_RDI[1]._vptr_GenericInputFile + 0xc) = *(undefined4 *)(in_RSI + 0x40);
  initialize(in_stack_00000420,in_stack_00000418);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_00000060,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             CONCAT44(in_stack_0000005c,in_stack_00000058));
  *(undefined4 *)((long)in_RDI[1]._vptr_GenericInputFile + 0x16c) = *(undefined4 *)(in_RSI + 0x3c);
  return;
}

Assistant:

DeepScanLineInputFile::DeepScanLineInputFile(InputPartData* part)
    
{

    _data = new Data(part->numThreads);
    _data->_deleteStream=false;
    _data->_streamData = part->mutex;
    _data->memoryMapped = _data->_streamData->is->isMemoryMapped();
    _data->version = part->version;

    try
    {
       initialize(part->header);
    }
    catch(...)
    {
        delete _data;
        throw;
    }
    _data->lineOffsets = part->chunkOffsets;

    _data->partNumber = part->partNumber;
}